

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::Loop8Test6Param_hbd_DISABLED_Speed_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::Loop8Test6Param_hbd_DISABLED_Speed_Test>
           *this)

{
  LoopTestParam<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_const_unsigned_char_*,_const_unsigned_char_*,_int),_std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>
  *this_00;
  
  WithParamInterface<std::tuple<void(*)(unsigned_short*,int,unsigned_char_const*,unsigned_char_const*,unsigned_char_const*,int),void(*)(unsigned_short*,int,unsigned_char_const*,unsigned_char_const*,unsigned_char_const*,int),int>>
  ::parameter_ = &this->parameter_;
  this_00 = (LoopTestParam<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_const_unsigned_char_*,_const_unsigned_char_*,_int),_std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>
             *)operator_new(0x30);
  anon_unknown.dwarf_3be7c4::
  LoopTestParam<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_const_unsigned_char_*,_const_unsigned_char_*,_int),_std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>
  ::LoopTestParam(this_00);
  (this_00->
  super_TestWithParam<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>
  ).super_Test._vptr_Test = (_func_int **)&PTR__TestWithParam_00eee520;
  (this_00->
  super_TestWithParam<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>
  ).
  super_WithParamInterface<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__Loop8Test6Param_hbd_DISABLED_Speed_Test_00eee560;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }